

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtil.h
# Opt level: O0

string * aeron::util::strPrintf_abi_cxx11_(string *__return_storage_ptr__,char *format,...)

{
  char in_AL;
  ulong uVar1;
  char *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_198 [16];
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  allocator local_dd [15];
  allocator local_ce;
  undefined1 local_cd;
  int local_cc;
  undefined4 local_c8;
  int len;
  va_list argp;
  char local_a8 [8];
  char buffer [128];
  int BUFFER_SIZE;
  char *format_local;
  string *output;
  
  if (in_AL != '\0') {
    local_168 = in_XMM0_Qa;
    local_158 = in_XMM1_Qa;
    local_148 = in_XMM2_Qa;
    local_138 = in_XMM3_Qa;
    local_128 = in_XMM4_Qa;
    local_118 = in_XMM5_Qa;
    local_108 = in_XMM6_Qa;
    local_f8 = in_XMM7_Qa;
  }
  argp[0].overflow_arg_area = local_198;
  argp[0]._0_8_ = &stack0x00000008;
  len = 0x30;
  local_c8 = 0x10;
  local_188 = in_RDX;
  local_180 = in_RCX;
  local_178 = in_R8;
  local_170 = in_R9;
  local_cc = vsnprintf(local_a8,0x80,format,&local_c8);
  if (local_cc < 0x80) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_a8,local_dd);
    std::allocator<char>::~allocator((allocator<char> *)local_dd);
  }
  else {
    local_cc = local_cc + 1;
    local_cd = 0;
    uVar1 = (ulong)local_cc;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,uVar1,' ',&local_ce);
    std::allocator<char>::~allocator((allocator<char> *)&local_ce);
    argp[0].overflow_arg_area = local_198;
    argp[0]._0_8_ = &stack0x00000008;
    len = 0x30;
    local_c8 = 0x10;
    __s = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    vsnprintf(__s,(long)local_cc,format,&local_c8);
    std::__cxx11::string::pop_back();
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string strPrintf(const char* format, ...)
{
    const int BUFFER_SIZE = 128;
    char buffer[BUFFER_SIZE];

    va_list argp;
    va_start(argp, format);
    int len = vsnprintf(buffer, BUFFER_SIZE, format, argp);
    va_end(argp);

    if (len >= BUFFER_SIZE)
    {
        len++;
        std::string output(len, ' ');

        va_start(argp, format);
        vsnprintf(&output[0], len, format, argp);
        va_end(argp);

        output.pop_back(); // remove trailing 0 char
        return output;
    }
    else
    {
        return std::string(buffer);
    }
}